

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O1

void plutovg_color_init_hsla(plutovg_color_t *color,float h,float s,float l,float a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = fmodf(h,360.0);
  fVar5 = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 360.0) & -(uint)(fVar1 < 0.0)
                 ) / 30.0;
  fVar2 = fmodf(fVar5 + 0.0,12.0);
  fVar1 = fVar2 + -3.0;
  if (9.0 - fVar2 <= fVar2 + -3.0) {
    fVar1 = 9.0 - fVar2;
  }
  fVar6 = (float)(~-(uint)(fVar1 < -1.0) & 0x3f800000 |
                 (~-(uint)(1.0 < fVar1) & 0xbf800000 | -(uint)(1.0 < fVar1) & 0x3f800000) &
                 -(uint)(fVar1 < -1.0));
  fVar2 = fVar6;
  if (fVar1 <= 1.0) {
    fVar2 = fVar1;
  }
  if (-1.0 <= fVar1) {
    fVar6 = fVar2;
  }
  fVar1 = l;
  if (1.0 - l <= l) {
    fVar1 = 1.0 - l;
  }
  fVar3 = fmodf(fVar5 + 8.0,12.0);
  fVar2 = fVar3 + -3.0;
  if (9.0 - fVar3 <= fVar3 + -3.0) {
    fVar2 = 9.0 - fVar3;
  }
  fVar3 = (float)(~-(uint)(fVar2 < -1.0) & 0x3f800000 |
                 (~-(uint)(1.0 < fVar2) & 0xbf800000 | -(uint)(1.0 < fVar2) & 0x3f800000) &
                 -(uint)(fVar2 < -1.0));
  fVar4 = fVar3;
  if (fVar2 <= 1.0) {
    fVar4 = fVar2;
  }
  fVar1 = -fVar1 * s;
  if (-1.0 <= fVar2) {
    fVar3 = fVar4;
  }
  fVar5 = fmodf(fVar5 + 4.0,12.0);
  fVar2 = fVar5 + -3.0;
  if (9.0 - fVar5 <= fVar5 + -3.0) {
    fVar2 = 9.0 - fVar5;
  }
  fVar5 = (float)(~-(uint)(fVar2 < -1.0) & 0x3f800000 |
                 (~-(uint)(1.0 < fVar2) & 0xbf800000 | -(uint)(1.0 < fVar2) & 0x3f800000) &
                 -(uint)(fVar2 < -1.0));
  fVar4 = fVar5;
  if (fVar2 <= 1.0) {
    fVar4 = fVar2;
  }
  fVar6 = fVar6 * fVar1 + l;
  fVar3 = fVar3 * fVar1 + l;
  if (-1.0 <= fVar2) {
    fVar5 = fVar4;
  }
  fVar2 = fVar1 * fVar5 + l;
  fVar1 = 1.0;
  if (fVar6 <= 1.0) {
    fVar1 = fVar6;
  }
  color->r = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (fVar3 <= 1.0) {
    fVar1 = fVar3;
  }
  color->g = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (fVar2 <= 1.0) {
    fVar1 = fVar2;
  }
  color->b = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
  fVar1 = 1.0;
  if (a <= 1.0) {
    fVar1 = a;
  }
  color->a = (float)(~-(uint)(a < 0.0) & (uint)fVar1);
  return;
}

Assistant:

void plutovg_color_init_hsla(plutovg_color_t* color, float h, float s, float l, float a)
{
    h = fmodf(h, 360.f);
    if(h < 0.f) { h += 360.f; }

    float r = hsl_component(h, s, l, 0);
    float g = hsl_component(h, s, l, 8);
    float b = hsl_component(h, s, l, 4);
    plutovg_color_init_rgba(color, r, g, b, a);
}